

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Stop_Freeze_R_PDU::Stop_Freeze_R_PDU
          (Stop_Freeze_R_PDU *this,Simulation_Management_Header *SimMgrHeader,
          ClockTime *RealWorldTime,StopFreezeReason SFR,FrozenBehavior FB,KUINT32 ReqID,
          RequiredReliabilityService RRS)

{
  Stop_Freeze_PDU::Stop_Freeze_PDU
            (&this->super_Stop_Freeze_PDU,SimMgrHeader,RealWorldTime,SFR,FB,ReqID);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header,RRS);
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  _vptr_Header6 = (_func_int **)&PTR__Stop_Freeze_R_PDU_002229c0;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Stop_Freeze_R_PDU_00222a00;
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8PDUType = '6';
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolFamily = '\n';
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui16PDULength = 0x28;
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Stop_Freeze_R_PDU::Stop_Freeze_R_PDU( const Simulation_Management_Header & SimMgrHeader, const ClockTime & RealWorldTime,
                                      StopFreezeReason SFR, FrozenBehavior FB, KUINT32 ReqID, RequiredReliabilityService RRS ) :
    Stop_Freeze_PDU( SimMgrHeader, RealWorldTime, SFR, FB, ReqID ),
    Reliability_Header( RRS )
{
    m_ui8PDUType = Stop_Freeze_R_PDU_Type;
    m_ui16PDULength = STOP_FREEZE_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}